

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

bool __thiscall
ON_Layer::HasPerViewportSettings(ON_Layer *this,ON_UUID viewport_id,uint settings_mask)

{
  bool bVar1;
  uint uVar2;
  ON__LayerExtensions *pOVar3;
  long lVar4;
  ON__LayerPerViewSettings *this_00;
  undefined1 in_R9B;
  long lVar5;
  bool bVar6;
  ON_UUID viewport_id_00;
  uchar *local_38;
  uchar local_30 [8];
  
  local_30 = viewport_id.Data4;
  local_38 = viewport_id._0_8_;
  if (settings_mask != 0) {
    bVar1 = ON_UuidIsNil((ON_UUID *)&local_38);
    if (bVar1) {
      pOVar3 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
      if (pOVar3 == (ON__LayerExtensions *)0x0) {
        return false;
      }
      lVar4 = (long)(pOVar3->m_vp_settings).m_count;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          uVar2 = ON__LayerPerViewSettings::SettingsMask
                            ((ON__LayerPerViewSettings *)
                             ((((pOVar3->m_vp_settings).m_a)->m_viewport_id).Data4 + lVar5 + -8));
          bVar1 = (uVar2 & settings_mask) != 0;
          if (bVar1) {
            return bVar1;
          }
          bVar6 = lVar4 * 0x28 + -0x28 != lVar5;
          lVar5 = lVar5 + 0x28;
        } while (bVar6);
        return bVar1;
      }
    }
    else {
      viewport_id_00.Data4[0] = '\0';
      viewport_id_00.Data4[1] = '\0';
      viewport_id_00.Data4[2] = '\0';
      viewport_id_00.Data4[3] = '\0';
      viewport_id_00.Data4[4] = '\0';
      viewport_id_00.Data4[5] = '\0';
      viewport_id_00.Data4[6] = '\0';
      viewport_id_00.Data4[7] = '\0';
      viewport_id_00._0_8_ = local_30;
      this_00 = ON__LayerExtensions::ViewportSettings
                          ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,local_38,
                           viewport_id_00,(bool)in_R9B);
      if ((this_00 != (ON__LayerPerViewSettings *)0x0) &&
         (uVar2 = ON__LayerPerViewSettings::SettingsMask(this_00), (uVar2 & settings_mask) != 0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Layer::HasPerViewportSettings(
    ON_UUID viewport_id,
    unsigned int settings_mask
    ) const
{

  if ( 0 != settings_mask )
  {
    if ( ON_UuidIsNil(viewport_id) )
    {
      const ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
      if ( 0 != ud )
      {
        const int count = ud->m_vp_settings.Count();
        for ( int i = 0; i < count; i++ )
        {
          const ON__LayerPerViewSettings& s = ud->m_vp_settings[i];
          if ( 0 != (settings_mask & s.SettingsMask()) )
            return true;
        }
      }
    }
    else
    {
      const ON__LayerPerViewSettings* pvs = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
      if ( 0 != pvs && 0 != (settings_mask & pvs->SettingsMask() ) )
        return true;
    }
  }

  return false;
}